

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

int main(void)

{
  ushort uVar1;
  Am_Object *pAVar2;
  Am_Value *pAVar3;
  Am_Constraint *pAVar4;
  Am_Object AVar5;
  Am_Object local_70;
  Am_Object c;
  Am_Object button;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  button.data = (Am_Object_Data *)0x0;
  Am_Initialize();
  Am_Object::Create((char *)&c);
  uVar1 = Am_Object::Set((ushort)&c,0x65,10);
  uVar1 = Am_Object::Set(uVar1,100,10);
  uVar1 = Am_Object::Set(uVar1,0.0,0x181);
  uVar1 = Am_Object::Set(uVar1,1.0,0x182);
  uVar1 = Am_Object::Set(uVar1,0.01,0x183);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,0.1,0x184);
  Am_Object::operator=(&R,pAVar2);
  Am_Object::~Am_Object(&c);
  c.data = (Am_Object_Data *)0x0;
  pAVar3 = (Am_Value *)Am_Object::Get(0x61d8,0xc5);
  Am_Object::operator=(&c,pAVar3);
  Am_Object::Set((ushort)&c,0.8,0x169);
  Am_Object::Create((char *)&local_70);
  uVar1 = Am_Object::Set((ushort)&local_70,100,10);
  uVar1 = Am_Object::Set(uVar1,0x65,0xdc);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)red_text);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,(Am_Constraint *)0xab,(ulong)pAVar4);
  Am_Object::operator=(&rt,pAVar2);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Create((char *)&local_70);
  uVar1 = Am_Object::Set((ushort)&local_70,0x65,10);
  uVar1 = Am_Object::Set(uVar1,100,0x28);
  uVar1 = Am_Object::Set(uVar1,0.0,0x181);
  uVar1 = Am_Object::Set(uVar1,1.0,0x182);
  uVar1 = Am_Object::Set(uVar1,0.01,0x183);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,0.1,0x184);
  Am_Object::operator=(&G,pAVar2);
  Am_Object::~Am_Object(&local_70);
  pAVar3 = (Am_Value *)Am_Object::Get(0x61e0,0xc5);
  Am_Object::operator=(&c,pAVar3);
  Am_Object::Set((ushort)&c,0.8,0x169);
  Am_Object::Create((char *)&local_70);
  uVar1 = Am_Object::Set((ushort)&local_70,100,0x28);
  uVar1 = Am_Object::Set(uVar1,0x65,0xdc);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)green_text);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,(Am_Constraint *)0xab,(ulong)pAVar4);
  Am_Object::operator=(&gt,pAVar2);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Create((char *)&local_70);
  uVar1 = Am_Object::Set((ushort)&local_70,0x65,10);
  uVar1 = Am_Object::Set(uVar1,100,0x46);
  uVar1 = Am_Object::Set(uVar1,0.0,0x181);
  uVar1 = Am_Object::Set(uVar1,1.0,0x182);
  uVar1 = Am_Object::Set(uVar1,0.01,0x183);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,0.1,0x184);
  Am_Object::operator=(&B,pAVar2);
  Am_Object::~Am_Object(&local_70);
  pAVar3 = (Am_Value *)Am_Object::Get(0x61e8,0xc5);
  Am_Object::operator=(&c,pAVar3);
  Am_Object::Set((ushort)&c,0.8,0x169);
  Am_Object::Create((char *)&local_70);
  uVar1 = Am_Object::Set((ushort)&local_70,100,0x46);
  uVar1 = Am_Object::Set(uVar1,0x65,0xdc);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)blue_text);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,(Am_Constraint *)0xab,(ulong)pAVar4);
  Am_Object::operator=(&bt,pAVar2);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Create((char *)&local_70);
  uVar1 = Am_Object::Set((ushort)&local_70,0x65,0x32);
  uVar1 = Am_Object::Set(uVar1,100,0x32);
  uVar1 = Am_Object::Set(uVar1,0x66,100);
  uVar1 = Am_Object::Set(uVar1,0x67,0x122);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)fill_from_scrolls);
  AVar5.data = (Am_Object_Data *)Am_Object::Set(uVar1,(Am_Constraint *)0x6a,(ulong)pAVar4);
  Am_Object::Create((char *)&local_28);
  uVar1 = Am_Object::Set((ushort)&local_28,100,10);
  uVar1 = Am_Object::Set(uVar1,0x65,0xfa);
  uVar1 = Am_Object::Set(uVar1,0x66,0x50);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)fill_from_scrolls);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,(Am_Constraint *)0x6a,(ulong)pAVar4);
  pAVar2 = (Am_Object *)Am_Object::operator=(&button,pAVar2);
  Am_Object::Am_Object(&local_20,pAVar2);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_20,0),1);
  Am_Object::Am_Object(&local_30,&R);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_30,0),1);
  Am_Object::Am_Object(&local_38,&G);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_38,0),1);
  Am_Object::Am_Object(&local_40,&B);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_40,0),1);
  Am_Object::Am_Object(&local_48,&rt);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_48,0),1);
  Am_Object::Am_Object(&local_50,&gt);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_50,0),1);
  Am_Object::Am_Object(&local_58,&bt);
  pAVar2 = (Am_Object *)Am_Object::Add_Part(AVar5,SUB81(&local_58,0),1);
  Am_Object::Am_Object(&local_18,pAVar2);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_18,0),1);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Get_Object((ushort)&local_70,(ulong)&button);
  uVar1 = Am_Object::Set((ushort)&local_70,(char *)0x150,0x10407b);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)kill_me.from_wrapper);
  Am_Object::~Am_Object(&local_70);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&c);
  Am_Object::~Am_Object(&button);
  return 0;
}

Assistant:

int
main(void)
{
  Am_Object button;
  Am_Initialize();

  R = Am_Vertical_Scroll_Bar.Create("Red")
          .Set(Am_TOP, 10)
          .Set(Am_LEFT, 10)
          .Set(Am_VALUE_1, 0.0)
          .Set(Am_VALUE_2, 1.0)
          .Set(Am_SMALL_INCREMENT, 0.01)
          .Set(Am_LARGE_INCREMENT, 0.1);
  Am_Object c;
  c = R.Get(Am_COMMAND);
  c.Set(Am_VALUE, 0.8);

  rt = Am_Text.Create("Red")
           .Set(Am_LEFT, 10)
           .Set(Am_TOP, 220)
           .Set(Am_TEXT, (red_text));

  G = Am_Vertical_Scroll_Bar.Create("Green")
          .Set(Am_TOP, 10)
          .Set(Am_LEFT, 40)
          .Set(Am_VALUE_1, 0.0)
          .Set(Am_VALUE_2, 1.0)
          .Set(Am_SMALL_INCREMENT, 0.01)
          .Set(Am_LARGE_INCREMENT, 0.1);
  c = G.Get(Am_COMMAND);
  c.Set(Am_VALUE, 0.8);

  gt = Am_Text.Create("green")
           .Set(Am_LEFT, 40)
           .Set(Am_TOP, 220)
           .Set(Am_TEXT, (green_text));

  B = Am_Vertical_Scroll_Bar.Create("Blue")
          .Set(Am_TOP, 10)
          .Set(Am_LEFT, 70)
          .Set(Am_VALUE_1, 0.0)
          .Set(Am_VALUE_2, 1.0)
          .Set(Am_SMALL_INCREMENT, 0.01)
          .Set(Am_LARGE_INCREMENT, 0.1);
  c = B.Get(Am_COMMAND);
  c.Set(Am_VALUE, 0.8);

  bt = Am_Text.Create("Blue")
           .Set(Am_LEFT, 70)
           .Set(Am_TOP, 220)
           .Set(Am_TEXT, (blue_text));

  Am_Screen.Add_Part(
      Am_Window.Create("window")
          .Set(Am_TOP, 50)
          .Set(Am_LEFT, 50)
          .Set(Am_WIDTH, 100)
          .Set(Am_HEIGHT, 290)
          .Set(Am_FILL_STYLE, (fill_from_scrolls))
          .Add_Part(button = Am_Button.Create("button")
                                 .Set(Am_LEFT, 10)
                                 .Set(Am_TOP, 250)
                                 .Set(Am_WIDTH, 80)
                                 .Set(Am_FILL_STYLE, (fill_from_scrolls)))
          .Add_Part(R)
          .Add_Part(G)
          .Add_Part(B)
          .Add_Part(rt)
          .Add_Part(gt)
          .Add_Part(bt));

  button.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "Goodbye")
      .Set(Am_DO_METHOD, kill_me);

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}